

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O2

void __thiscall stackjit::ClassMetadata::insertField(ClassMetadata *this,string *name,Field *field)

{
  size_type sVar1;
  runtime_error *this_00;
  __hashtable *__h;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined8 local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  sVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count(&(this->mFields)._M_h,name);
  if (sVar1 == 0) {
    std::__cxx11::string::string((string *)&local_c0,(string *)name);
    local_90._0_1_ = field->mAccessModifier;
    local_90._1_1_ = field->mIsDefined;
    local_90._2_6_ = *(undefined6 *)&field->field_0x12;
    local_a0 = *(undefined4 *)&field->mType;
    uStack_9c = *(undefined4 *)((long)&field->mType + 4);
    uStack_98 = (undefined4)field->mOffset;
    uStack_94 = *(undefined4 *)((long)&field->mOffset + 4);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,stackjit::Field>,std::allocator<std::pair<std::__cxx11::string_const,stackjit::Field>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string_const,stackjit::Field>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,stackjit::Field>,std::allocator<std::pair<std::__cxx11::string_const,stackjit::Field>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->mFields,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_88,"The field \'",name);
  std::operator+(&local_68,&local_88,"\' is already defined in the class \'");
  std::operator+(&local_48,&local_68,&this->mName);
  std::operator+(&local_c0,&local_48,"\'.");
  std::runtime_error::runtime_error(this_00,(string *)&local_c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ClassMetadata::insertField(const std::string& name, const Field& field) {
		if (mFields.count(name) > 0) {
			throw std::runtime_error("The field '" + name + "' is already defined in the class '" + mName + "'.");
		}

		mFields.insert({ name, field });
	}